

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenUnPackForUnion
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  IdlNamer *this_00;
  EnumDef *def;
  string sStack_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string union_type;
  string field_field;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string struct_var;
  string field_method;
  
  this_00 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&field_field,this_00);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&field_method,this_00,field);
  (*(this_00->super_Namer)._vptr_Namer[7])(&struct_var,this_00,struct_def);
  def = (field->value).type.enum_def;
  (*(this_00->super_Namer)._vptr_Namer[0xf])(&union_type,this_00,def);
  if ((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers == true) {
    IdlNamer::NamespacedType_abi_cxx11_(&sStack_248,this_00,&def->super_Definition);
    std::operator+(&local_228,&sStack_248,".");
    std::operator+(&local_208,&local_228,&union_type);
    std::__cxx11::string::operator=((string *)&union_type,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&sStack_248);
  }
  GenIndents_abi_cxx11_(&local_1a8,this,2);
  std::operator+(&local_188,&local_1a8,"self.");
  std::operator+(&local_168,&local_188,&field_field);
  std::operator+(&local_148,&local_168," = ");
  std::operator+(&local_128,&local_148,&union_type);
  std::operator+(&local_108,&local_128,"Creator(");
  std::operator+(&local_e8,&local_108,"self.");
  std::operator+(&local_c8,&local_e8,&field_field);
  std::operator+(&local_a8,&local_c8,"Type, ");
  std::operator+(&local_88,&local_a8,&struct_var);
  std::operator+(&sStack_248,&local_88,".");
  std::operator+(&local_228,&sStack_248,&field_method);
  std::operator+(&local_208,&local_228,"())");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&sStack_248);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&union_type);
  std::__cxx11::string::~string((string *)&struct_var);
  std::__cxx11::string::~string((string *)&field_method);
  std::__cxx11::string::~string((string *)&field_field);
  return;
}

Assistant:

void GenUnPackForUnion(const StructDef &struct_def, const FieldDef &field,
                         std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_var = namer_.Variable(struct_def);
    const EnumDef &enum_def = *field.value.type.enum_def;
    auto union_type = namer_.Type(enum_def);

    if (parser_.opts.include_dependence_headers) {
      union_type = namer_.NamespacedType(enum_def) + "." + union_type;
    }
    code += GenIndents(2) + "self." + field_field + " = " + union_type +
            "Creator(" + "self." + field_field + "Type, " + struct_var + "." +
            field_method + "())";
  }